

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_core.c
# Opt level: O2

void rxa2_initial_hash(uint8_t *blockhash,argon2_context *context,argon2_type type)

{
  undefined4 uStack_128;
  uint8_t value [4];
  blake2b_state BlakeHash;
  
  if (blockhash != (uint8_t *)0x0 && context != (argon2_context *)0x0) {
    blake2b_init(&BlakeHash,0x40);
    value = (uint8_t  [4])context->lanes;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->outlen;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->m_cost;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->t_cost;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->version;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])type;
    blake2b_update(&BlakeHash,value,4);
    value = (uint8_t  [4])context->pwdlen;
    blake2b_update(&BlakeHash,value,4);
    if (context->pwd != (uint8_t *)0x0) {
      blake2b_update(&BlakeHash,context->pwd,(ulong)context->pwdlen);
      if ((context->flags & 1) != 0) {
        rxa2_secure_wipe_memory((void *)BlakeHash.h[0],CONCAT44(value,uStack_128));
        context->pwdlen = 0;
      }
    }
    value = (uint8_t  [4])context->saltlen;
    blake2b_update(&BlakeHash,value,4);
    if (context->salt != (uint8_t *)0x0) {
      blake2b_update(&BlakeHash,context->salt,(ulong)context->saltlen);
    }
    value = (uint8_t  [4])context->secretlen;
    blake2b_update(&BlakeHash,value,4);
    if (context->secret != (uint8_t *)0x0) {
      blake2b_update(&BlakeHash,context->secret,(ulong)context->secretlen);
      if ((context->flags & 2) != 0) {
        rxa2_secure_wipe_memory((void *)BlakeHash.h[0],CONCAT44(value,uStack_128));
        context->secretlen = 0;
      }
    }
    value = (uint8_t  [4])context->adlen;
    blake2b_update(&BlakeHash,value,4);
    if (context->ad != (uint8_t *)0x0) {
      blake2b_update(&BlakeHash,context->ad,(ulong)context->adlen);
    }
    blake2b_final(&BlakeHash,blockhash,0x40);
  }
  return;
}

Assistant:

void rxa2_initial_hash(uint8_t *blockhash, argon2_context *context, argon2_type type) {
	blake2b_state BlakeHash;
	uint8_t value[sizeof(uint32_t)];

	if (NULL == context || NULL == blockhash) {
		return;
	}

	blake2b_init(&BlakeHash, ARGON2_PREHASH_DIGEST_LENGTH);

	store32(&value, context->lanes);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->outlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->m_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->t_cost);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->version);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, (uint32_t)type);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	store32(&value, context->pwdlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->pwd != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->pwd,
			context->pwdlen);

		if (context->flags & ARGON2_FLAG_CLEAR_PASSWORD) {
			rxa2_secure_wipe_memory(context->pwd, context->pwdlen);
			context->pwdlen = 0;
		}
	}

	store32(&value, context->saltlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->salt != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->salt, context->saltlen);
	}

	store32(&value, context->secretlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->secret != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->secret,
			context->secretlen);

		if (context->flags & ARGON2_FLAG_CLEAR_SECRET) {
			rxa2_secure_wipe_memory(context->secret, context->secretlen);
			context->secretlen = 0;
		}
	}

	store32(&value, context->adlen);
	blake2b_update(&BlakeHash, (const uint8_t *)&value, sizeof(value));

	if (context->ad != NULL) {
		blake2b_update(&BlakeHash, (const uint8_t *)context->ad,
			context->adlen);
	}

	blake2b_final(&BlakeHash, blockhash, ARGON2_PREHASH_DIGEST_LENGTH);
}